

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O1

void __thiscall
lzham::quasi_adaptive_huffman_data_model::reset_update_rate(quasi_adaptive_huffman_data_model *this)

{
  unsigned_short *puVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = (this->m_update_cycle - this->m_symbols_until_update) + this->m_total_count;
  this->m_total_count = uVar3;
  if (this->m_total_syms < uVar3) {
    if (this->m_total_syms == 0) {
      uVar2 = 0;
    }
    else {
      uVar4 = 0;
      uVar2 = 0;
      do {
        puVar1 = (this->m_sym_freq).m_p;
        uVar3 = puVar1[uVar4] + 1 >> 1;
        uVar2 = uVar2 + uVar3;
        puVar1[uVar4] = (unsigned_short)uVar3;
        uVar4 = uVar4 + 1;
      } while (uVar4 < this->m_total_syms);
    }
    this->m_total_count = uVar2;
  }
  uVar3 = 8;
  if (this->m_update_cycle < 8) {
    uVar3 = this->m_update_cycle;
  }
  this->m_update_cycle = uVar3;
  this->m_symbols_until_update = uVar3;
  return;
}

Assistant:

void quasi_adaptive_huffman_data_model::reset_update_rate()
   {
      m_total_count += (m_update_cycle - m_symbols_until_update);

#ifdef LZHAM_BUILD_DEBUG
      uint actual_total = 0;
      for (uint i = 0; i < m_sym_freq.size(); i++)
         actual_total += m_sym_freq[i];
      LZHAM_ASSERT(actual_total == m_total_count);
#endif

      if (m_total_count > m_total_syms)
         rescale();

      m_symbols_until_update = m_update_cycle = LZHAM_MIN(8, m_update_cycle);
   }